

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O1

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeDataDrop(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Name data)

{
  DataDrop *this_00;
  
  this_00 = (DataDrop *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x20,8);
  *(undefined8 *)&(this_00->super_SpecificExpression<(wasm::Expression::Id)37>).super_Expression = 0
  ;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)37>).super_Expression.type.id = 0;
  (this_00->segment).super_IString.str._M_len = 0;
  (this_00->segment).super_IString.str._M_str = (char *)0x0;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)37>).super_Expression._id = DataDropId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)37>).super_Expression.type.id = 0;
  (this_00->segment).super_IString.str._M_len = 0;
  (this_00->segment).super_IString.str._M_len = data.super_IString.str._M_len;
  (this_00->segment).super_IString.str._M_str = data.super_IString.str._M_str;
  DataDrop::finalize(this_00);
  push(this,(Expression *)this_00);
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeDataDrop(Name data) {
  push(builder.makeDataDrop(data));
  return Ok{};
}